

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O0

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Dvd::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Dvd *this)

{
  uint32_t uVar1;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_00;
  SingleMthdTest *pSVar2;
  result_type rVar3;
  MthdNotify *this_00;
  MthdPmTrigger *this_01;
  MthdDmaNotify *this_02;
  MthdDmaGrobj *pMVar4;
  MthdDmaSurf *this_03;
  MthdSifmXy *this_04;
  MthdSifmRect *this_05;
  MthdSurfDvdFormat *this_06;
  MthdSurfOffset *this_07;
  MthdSifmDuDx *pMVar5;
  MthdSifmDvDy *pMVar6;
  MthdSifmSrcSize *pMVar7;
  MthdDvdSrcFormat *pMVar8;
  MthdSifmOffset *pMVar9;
  MthdSifmSrcPos *pMVar10;
  allocator local_4d9;
  string local_4d8 [32];
  SingleMthdTest *local_4b8;
  iterator local_4b0;
  undefined8 local_4a8;
  __normal_iterator<hwtest::pgraph::SingleMthdTest_**,_std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>_>
  local_4a0;
  const_iterator local_498;
  allocator<hwtest::pgraph::SingleMthdTest_*> local_48b;
  undefined1 local_48a;
  allocator local_489;
  string local_488 [38];
  undefined1 local_462;
  allocator local_461;
  string local_460 [38];
  undefined1 local_43a;
  allocator local_439;
  string local_438 [38];
  undefined1 local_412;
  allocator local_411;
  string local_410 [38];
  undefined1 local_3ea;
  allocator local_3e9;
  string local_3e8 [38];
  undefined1 local_3c2;
  allocator local_3c1;
  string local_3c0 [38];
  undefined1 local_39a;
  allocator local_399;
  string local_398 [38];
  undefined1 local_372;
  allocator local_371;
  string local_370 [38];
  undefined1 local_34a;
  allocator local_349;
  string local_348 [38];
  undefined1 local_322;
  allocator local_321;
  string local_320 [38];
  undefined1 local_2fa;
  allocator local_2f9;
  string local_2f8 [38];
  undefined1 local_2d2;
  allocator local_2d1;
  string local_2d0 [38];
  undefined1 local_2aa;
  allocator local_2a9;
  string local_2a8 [38];
  undefined1 local_282;
  allocator local_281;
  string local_280 [38];
  undefined1 local_25a;
  allocator local_259;
  string local_258 [38];
  undefined1 local_232;
  allocator local_231;
  string local_230 [38];
  undefined1 local_20a;
  allocator local_209;
  string local_208 [38];
  undefined1 local_1e2;
  allocator local_1e1;
  string local_1e0 [38];
  undefined1 local_1ba;
  allocator local_1b9;
  string local_1b8 [38];
  undefined1 local_192;
  allocator local_191;
  string local_190 [38];
  undefined1 local_16a;
  allocator local_169;
  string local_168 [38];
  undefined1 local_142;
  allocator local_141;
  string local_140 [38];
  undefined1 local_11a;
  allocator local_119;
  string local_118 [48];
  SingleMthdTest *local_e8;
  MthdNotify *local_e0;
  MthdPmTrigger *local_d8;
  MthdDmaNotify *local_d0;
  MthdDmaGrobj *local_c8;
  MthdDmaGrobj *local_c0;
  MthdDmaSurf *local_b8;
  MthdSifmXy *local_b0;
  MthdSifmRect *local_a8;
  MthdSurfDvdFormat *local_a0;
  MthdSurfOffset *local_98;
  MthdSifmDuDx *local_90;
  MthdSifmDvDy *local_88;
  MthdSifmSrcSize *local_80;
  MthdDvdSrcFormat *local_78;
  MthdSifmOffset *local_70;
  MthdSifmSrcPos *local_68;
  MthdSifmDuDx *local_60;
  MthdSifmDvDy *local_58;
  MthdSifmSrcSize *local_50;
  MthdDvdSrcFormat *local_48;
  MthdSifmOffset *local_40;
  MthdSifmSrcPos *local_38;
  iterator local_30;
  size_type local_28;
  undefined1 local_19;
  Dvd *local_18;
  Dvd *this_local;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *res;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Dvd *)__return_storage_ptr__;
  pSVar2 = (SingleMthdTest *)operator_new(0x25950);
  local_11a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"nop",&local_119);
  MthdNop::SingleMthdTest
            ((MthdNop *)pSVar2,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_118,-1,
             (this->super_Class).cls,0x100,1,4);
  local_11a = 0;
  local_e8 = pSVar2;
  this_00 = (MthdNotify *)operator_new(0x25950);
  local_142 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"notify",&local_141);
  MthdNotify::SingleMthdTest
            (this_00,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_140,0,
             (this->super_Class).cls,0x104,1,4);
  local_142 = 0;
  local_e0 = this_00;
  this_01 = (MthdPmTrigger *)operator_new(0x25950);
  local_16a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"pm_trigger",&local_169);
  MthdPmTrigger::SingleMthdTest
            (this_01,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_168,-1,
             (this->super_Class).cls,0x140,1,4);
  local_16a = 0;
  local_d8 = this_01;
  this_02 = (MthdDmaNotify *)operator_new(0x25950);
  local_192 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"dma_notify",&local_191);
  MthdDmaNotify::SingleMthdTest
            (this_02,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_190,1,
             (this->super_Class).cls,0x180,1,4);
  local_192 = 0;
  local_d0 = this_02;
  pMVar4 = (MthdDmaGrobj *)operator_new(0x25960);
  local_1ba = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"dma_ov",&local_1b9);
  MthdDmaGrobj::MthdDmaGrobj
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_1b8,2,
             (this->super_Class).cls,0x184,1,0);
  local_1ba = 0;
  local_c8 = pMVar4;
  pMVar4 = (MthdDmaGrobj *)operator_new(0x25960);
  local_1e2 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"dma_src",&local_1e1);
  MthdDmaGrobj::MthdDmaGrobj
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_1e0,3,
             (this->super_Class).cls,0x188,0,0);
  local_1e2 = 0;
  local_c0 = pMVar4;
  this_03 = (MthdDmaSurf *)operator_new(0x25958);
  local_20a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"dma_surf",&local_209);
  uVar1 = (this->super_Class).cls;
  MthdDmaSurf::MthdDmaSurf
            (this_03,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_208,4,uVar1,0x18c,4,
             (uVar1 == 0x88) + 1);
  local_20a = 0;
  local_b8 = this_03;
  this_04 = (MthdSifmXy *)operator_new(0x25950);
  local_232 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"xy",&local_231);
  anon_unknown_17::MthdSifmXy::SingleMthdTest
            (this_04,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_230,5,
             (this->super_Class).cls,0x300,1,4);
  local_232 = 0;
  local_b0 = this_04;
  this_05 = (MthdSifmRect *)operator_new(0x25950);
  local_25a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"rect",&local_259);
  anon_unknown_17::MthdSifmRect::SingleMthdTest
            (this_05,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_258,6,
             (this->super_Class).cls,0x304,1,4);
  local_25a = 0;
  local_a8 = this_05;
  this_06 = (MthdSurfDvdFormat *)operator_new(0x25950);
  local_282 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"surf_format",&local_281);
  anon_unknown_17::MthdSurfDvdFormat::SingleMthdTest
            (this_06,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_280,7,
             (this->super_Class).cls,0x308,1,4);
  local_282 = 0;
  local_a0 = this_06;
  this_07 = (MthdSurfOffset *)operator_new(0x25958);
  local_2aa = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"surf_offset",&local_2a9);
  uVar1 = (this->super_Class).cls;
  MthdSurfOffset::MthdSurfOffset
            (this_07,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_2a8,8,uVar1,0x30c,4,
             (uVar1 == 0x88) + 1);
  local_2aa = 0;
  local_98 = this_07;
  pMVar5 = (MthdSifmDuDx *)operator_new(0x25958);
  local_2d2 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"src.dudx",&local_2d1);
  anon_unknown_17::MthdSifmDuDx::MthdSifmDuDx
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_2d0,9,
             (this->super_Class).cls,0x310,0);
  local_2d2 = 0;
  local_90 = pMVar5;
  pMVar6 = (MthdSifmDvDy *)operator_new(0x25958);
  local_2fa = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"src.dvdy",&local_2f9);
  anon_unknown_17::MthdSifmDvDy::MthdSifmDvDy
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_2f8,10,
             (this->super_Class).cls,0x314,0);
  local_2fa = 0;
  local_88 = pMVar6;
  pMVar7 = (MthdSifmSrcSize *)operator_new(0x25958);
  local_322 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"src.size",&local_321);
  anon_unknown_17::MthdSifmSrcSize::MthdSifmSrcSize
            (pMVar7,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_320,0xb,
             (this->super_Class).cls,0x318,0);
  local_322 = 0;
  local_80 = pMVar7;
  pMVar8 = (MthdDvdSrcFormat *)operator_new(0x25958);
  local_34a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"src.format",&local_349);
  anon_unknown_17::MthdDvdSrcFormat::MthdDvdSrcFormat
            (pMVar8,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_348,0xc,
             (this->super_Class).cls,0x31c,0);
  local_34a = 0;
  local_78 = pMVar8;
  pMVar9 = (MthdSifmOffset *)operator_new(0x25958);
  local_372 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"src.offset",&local_371);
  anon_unknown_17::MthdSifmOffset::MthdSifmOffset
            (pMVar9,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_370,0xd,
             (this->super_Class).cls,800,0);
  local_372 = 0;
  local_70 = pMVar9;
  pMVar10 = (MthdSifmSrcPos *)operator_new(0x25958);
  local_39a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"src.pos",&local_399);
  anon_unknown_17::MthdSifmSrcPos::MthdSifmSrcPos
            (pMVar10,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_398,0xe,
             (this->super_Class).cls,0x324,0,false);
  local_39a = 0;
  local_68 = pMVar10;
  pMVar5 = (MthdSifmDuDx *)operator_new(0x25958);
  local_3c2 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"ov.dudx",&local_3c1);
  anon_unknown_17::MthdSifmDuDx::MthdSifmDuDx
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_3c0,0xf,
             (this->super_Class).cls,0x328,1);
  local_3c2 = 0;
  local_60 = pMVar5;
  pMVar6 = (MthdSifmDvDy *)operator_new(0x25958);
  local_3ea = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e8,"ov.dvdy",&local_3e9);
  anon_unknown_17::MthdSifmDvDy::MthdSifmDvDy
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_3e8,0x10,
             (this->super_Class).cls,0x32c,1);
  local_3ea = 0;
  local_58 = pMVar6;
  pMVar7 = (MthdSifmSrcSize *)operator_new(0x25958);
  local_412 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_410,"ov.size",&local_411);
  anon_unknown_17::MthdSifmSrcSize::MthdSifmSrcSize
            (pMVar7,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_410,0x11,
             (this->super_Class).cls,0x330,1);
  local_412 = 0;
  local_50 = pMVar7;
  pMVar8 = (MthdDvdSrcFormat *)operator_new(0x25958);
  local_43a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,"ov.format",&local_439);
  anon_unknown_17::MthdDvdSrcFormat::MthdDvdSrcFormat
            (pMVar8,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_438,0x12,
             (this->super_Class).cls,0x334,1);
  local_43a = 0;
  local_48 = pMVar8;
  pMVar9 = (MthdSifmOffset *)operator_new(0x25958);
  local_462 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_460,"ov.offset",&local_461);
  anon_unknown_17::MthdSifmOffset::MthdSifmOffset
            (pMVar9,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_460,0x13,
             (this->super_Class).cls,0x338,1);
  local_462 = 0;
  local_40 = pMVar9;
  pMVar10 = (MthdSifmSrcPos *)operator_new(0x25958);
  local_48a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_488,"ov.pos",&local_489);
  anon_unknown_17::MthdSifmSrcPos::MthdSifmSrcPos
            (pMVar10,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_488,0x14,
             (this->super_Class).cls,0x33c,1,true);
  local_48a = 0;
  local_30 = &local_e8;
  local_28 = 0x17;
  local_38 = pMVar10;
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::allocator(&local_48b);
  __l_00._M_len = local_28;
  __l_00._M_array = local_30;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(__return_storage_ptr__,__l_00,&local_48b);
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::~allocator(&local_48b);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  if (((this->super_Class).cls & 0xff) == 0x88) {
    local_4a0._M_current =
         (SingleMthdTest **)
         std::
         vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
         ::begin(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
    ::__normal_iterator<hwtest::pgraph::SingleMthdTest**>
              ((__normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
                *)&local_498,&local_4a0);
    pSVar2 = (SingleMthdTest *)operator_new(0x25950);
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4d8,"sync",&local_4d9);
    MthdSync::SingleMthdTest
              ((MthdSync *)pSVar2,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_4d8,-1,
               (this->super_Class).cls,0x108,1,4);
    local_4b0 = &local_4b8;
    local_4a8 = 1;
    __l._M_len = 1;
    __l._M_array = local_4b0;
    local_4b8 = pSVar2;
    std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
    ::insert(__return_storage_ptr__,local_498,__l);
    std::__cxx11::string::~string(local_4d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleMthdTest *> Dvd::mthds() {
	std::vector<SingleMthdTest *> res = {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_ov", 2, cls, 0x184, 1, DMA_R),
		new MthdDmaGrobj(opt, rnd(), "dma_src", 3, cls, 0x188, 0, DMA_R),
		new MthdDmaSurf(opt, rnd(), "dma_surf", 4, cls, 0x18c, 4, cls == 0x88 ? SURF_NV10 : SURF_NV4),
		new MthdSifmXy(opt, rnd(), "xy", 5, cls, 0x300),
		new MthdSifmRect(opt, rnd(), "rect", 6, cls, 0x304),
		new MthdSurfDvdFormat(opt, rnd(), "surf_format", 7, cls, 0x308),
		new MthdSurfOffset(opt, rnd(), "surf_offset", 8, cls, 0x30c, 4, cls == 0x88 ? SURF_NV10 : SURF_NV4),
		new MthdSifmDuDx(opt, rnd(), "src.dudx", 9, cls, 0x310, 0),
		new MthdSifmDvDy(opt, rnd(), "src.dvdy", 10, cls, 0x314, 0),
		new MthdSifmSrcSize(opt, rnd(), "src.size", 11, cls, 0x318, 0),
		new MthdDvdSrcFormat(opt, rnd(), "src.format", 12, cls, 0x31c, 0),
		new MthdSifmOffset(opt, rnd(), "src.offset", 13, cls, 0x320, 0),
		new MthdSifmSrcPos(opt, rnd(), "src.pos", 14, cls, 0x324, 0, false),
		new MthdSifmDuDx(opt, rnd(), "ov.dudx", 15, cls, 0x328, 1),
		new MthdSifmDvDy(opt, rnd(), "ov.dvdy", 16, cls, 0x32c, 1),
		new MthdSifmSrcSize(opt, rnd(), "ov.size", 17, cls, 0x330, 1),
		new MthdDvdSrcFormat(opt, rnd(), "ov.format", 18, cls, 0x334, 1),
		new MthdSifmOffset(opt, rnd(), "ov.offset", 19, cls, 0x338, 1),
		new MthdSifmSrcPos(opt, rnd(), "ov.pos", 20, cls, 0x33c, 1, true),
	};
	if ((cls & 0xff) == 0x88) {
		res.insert(res.begin(), {
			new MthdSync(opt, rnd(), "sync", -1, cls, 0x108),
		});
	}
	return res;
}